

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_conncache_close_all_connections(conncache *connc)

{
  undefined1 local_4c8 [8];
  sigpipe_ignore pipe_st;
  char buffer [1025];
  connectdata *local_18;
  connectdata *conn;
  conncache *connc_local;
  
  if (connc->closure_handle != (Curl_easy *)0x0) {
    (connc->closure_handle->state).buffer = &pipe_st.no_signal;
    (connc->closure_handle->set).buffer_size = 0x400;
    local_18 = conncache_find_first_connection(connc);
    while (local_18 != (connectdata *)0x0) {
      sigpipe_ignore(connc->closure_handle,(sigpipe_ignore *)local_4c8);
      Curl_conncontrol(local_18,1);
      Curl_conncache_remove_conn(connc->closure_handle,local_18,true);
      Curl_disconnect(connc->closure_handle,local_18,false);
      sigpipe_restore((sigpipe_ignore *)local_4c8);
      local_18 = conncache_find_first_connection(connc);
    }
    (connc->closure_handle->state).buffer = (char *)0x0;
    sigpipe_ignore(connc->closure_handle,(sigpipe_ignore *)local_4c8);
    Curl_hostcache_clean(connc->closure_handle,(connc->closure_handle->dns).hostcache);
    Curl_close(&connc->closure_handle);
    sigpipe_restore((sigpipe_ignore *)local_4c8);
  }
  return;
}

Assistant:

void Curl_conncache_close_all_connections(struct conncache *connc)
{
  struct connectdata *conn;
  char buffer[READBUFFER_MIN + 1];
  SIGPIPE_VARIABLE(pipe_st);
  if(!connc->closure_handle)
    return;
  connc->closure_handle->state.buffer = buffer;
  connc->closure_handle->set.buffer_size = READBUFFER_MIN;

  conn = conncache_find_first_connection(connc);
  while(conn) {
    sigpipe_ignore(connc->closure_handle, &pipe_st);
    /* This will remove the connection from the cache */
    connclose(conn, "kill all");
    Curl_conncache_remove_conn(connc->closure_handle, conn, TRUE);
    Curl_disconnect(connc->closure_handle, conn, FALSE);
    sigpipe_restore(&pipe_st);

    conn = conncache_find_first_connection(connc);
  }

  connc->closure_handle->state.buffer = NULL;
  sigpipe_ignore(connc->closure_handle, &pipe_st);

  Curl_hostcache_clean(connc->closure_handle,
                       connc->closure_handle->dns.hostcache);
  Curl_close(&connc->closure_handle);
  sigpipe_restore(&pipe_st);
}